

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O0

void highbd_calc16x16var_avx2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,uint32_t *sse,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int in_ECX;
  undefined1 (*in_RDX) [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i v_d;
  __m128i v_d1_d;
  __m128i v_d0_d;
  __m256i v_d_lh;
  __m256i v_d_h;
  __m256i v_d_l;
  __m256i v_sum0;
  __m256i v_sqrdiff;
  __m256i v_diff;
  __m256i v_p_b;
  __m256i v_p_a;
  int i;
  __m256i one;
  __m256i v_sse_d;
  __m256i v_sum_d;
  undefined4 local_530;
  undefined4 uStack_52c;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined1 auStack_4f0 [16];
  int local_3e4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 (*local_358) [32];
  undefined1 (*local_348) [32];
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_3a0 = ZEXT1632(ZEXT816(0));
  local_3c0 = ZEXT1632(ZEXT816(0));
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar4 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar4 = vpinsrw_avx(auVar4,1,2);
  auVar4 = vpinsrw_avx(auVar4,1,3);
  auVar4 = vpinsrw_avx(auVar4,1,4);
  auVar4 = vpinsrw_avx(auVar4,1,5);
  auVar4 = vpinsrw_avx(auVar4,1,6);
  auVar4 = vpinsrw_avx(auVar4,1,7);
  auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_70 = auVar5._0_8_;
  uStack_68 = auVar5._8_8_;
  local_3e4 = 0;
  local_358 = in_RDX;
  local_348 = in_RDI;
  while( true ) {
    if (0xf < local_3e4) break;
    auVar3 = vpsubw_avx2(*local_348,*local_358);
    auVar2 = vpmaddwd_avx2(auVar3,auVar3);
    local_3a0 = vpaddw_avx2(local_3a0,auVar3);
    local_3c0 = vpaddd_avx2(local_3c0,auVar2);
    local_348 = (undefined1 (*) [32])(*local_348 + (long)in_ESI * 2);
    local_358 = (undefined1 (*) [32])(*local_358 + (long)in_ECX * 2);
    local_3e4 = local_3e4 + 1;
  }
  auVar2._16_8_ = uStack_70;
  auVar2._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar4;
  auVar2._24_8_ = uStack_68;
  auVar2 = vpmaddwd_avx2(local_3a0,auVar2);
  auVar3 = vpunpckldq_avx2(auVar2,local_3c0);
  auVar2 = vpunpckhdq_avx2(auVar2,local_3c0);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auStack_4f0 = auVar2._16_16_;
  auVar1._8_8_ = uStack_518;
  auVar1._0_8_ = local_520;
  auVar1 = vpaddd_avx(auStack_4f0,auVar1);
  auVar4 = vpsrldq_avx(auVar1,8);
  auVar1 = vpaddd_avx(auVar1,auVar4);
  local_530 = auVar1._0_4_;
  *in_R9 = local_530;
  uStack_52c = auVar1._4_4_;
  *in_R8 = uStack_52c;
  return;
}

Assistant:

static void highbd_calc16x16var_avx2(const uint16_t *src, int src_stride,
                                     const uint16_t *ref, int ref_stride,
                                     uint32_t *sse, int *sum) {
  __m256i v_sum_d = _mm256_setzero_si256();
  __m256i v_sse_d = _mm256_setzero_si256();
  const __m256i one = _mm256_set1_epi16(1);
  for (int i = 0; i < 16; ++i) {
    const __m256i v_p_a = _mm256_loadu_si256((const __m256i *)src);
    const __m256i v_p_b = _mm256_loadu_si256((const __m256i *)ref);
    const __m256i v_diff = _mm256_sub_epi16(v_p_a, v_p_b);
    const __m256i v_sqrdiff = _mm256_madd_epi16(v_diff, v_diff);
    v_sum_d = _mm256_add_epi16(v_sum_d, v_diff);
    v_sse_d = _mm256_add_epi32(v_sse_d, v_sqrdiff);
    src += src_stride;
    ref += ref_stride;
  }
  __m256i v_sum0 = _mm256_madd_epi16(v_sum_d, one);
  __m256i v_d_l = _mm256_unpacklo_epi32(v_sum0, v_sse_d);
  __m256i v_d_h = _mm256_unpackhi_epi32(v_sum0, v_sse_d);
  __m256i v_d_lh = _mm256_add_epi32(v_d_l, v_d_h);
  const __m128i v_d0_d = _mm256_castsi256_si128(v_d_lh);
  const __m128i v_d1_d = _mm256_extracti128_si256(v_d_lh, 1);
  __m128i v_d = _mm_add_epi32(v_d0_d, v_d1_d);
  v_d = _mm_add_epi32(v_d, _mm_srli_si128(v_d, 8));
  *sum = _mm_extract_epi32(v_d, 0);
  *sse = _mm_extract_epi32(v_d, 1);
}